

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object___lookupGetter__
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int setter)

{
  int *piVar1;
  JSAtom prop;
  int iVar2;
  JSRefCountHeader *p;
  JSValue *pJVar3;
  ulong uVar4;
  ulong uVar5;
  JSValue JVar6;
  int64_t local_78;
  JSPropertyDescriptor desc;
  
  JVar6 = JS_ToObject(ctx,this_val);
  local_78 = 6;
  if (((int)JVar6.tag == 6) || (prop = JS_ValueToAtom(ctx,*argv), prop == 0)) {
    prop = 0;
  }
  else {
    while( true ) {
      iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)JVar6.u.ptr,prop);
      if (iVar2 < 0) break;
      if (iVar2 != 0) {
        if (((byte)desc.flags & 0x10) == 0) {
          local_78 = 3;
          uVar4 = 0;
          uVar5 = 0;
        }
        else {
          pJVar3 = &desc.getter;
          if (setter != 0) {
            pJVar3 = &desc.setter;
          }
          piVar1 = (int *)(pJVar3->u).ptr;
          pJVar3 = &desc.getter;
          if (setter != 0) {
            pJVar3 = &desc.setter;
          }
          local_78 = pJVar3->tag;
          if (0xfffffff4 < (uint)local_78) {
            *piVar1 = *piVar1 + 1;
          }
          uVar5 = (ulong)piVar1 & 0xffffffff00000000;
          uVar4 = (ulong)piVar1 & 0xffffffff;
        }
        js_free_desc(ctx,&desc);
        goto LAB_0015305b;
      }
      JVar6 = JS_GetPrototypeFree(ctx,JVar6);
      if ((int)JVar6.tag == 2) {
        local_78 = 3;
        break;
      }
      if (((int)JVar6.tag == 6) || (iVar2 = js_poll_interrupts(ctx), iVar2 != 0)) break;
    }
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_0015305b:
  JS_FreeAtom(ctx,prop);
  JS_FreeValue(ctx,JVar6);
  JVar6.tag = local_78;
  JVar6.u.ptr = (void *)(uVar4 | uVar5);
  return JVar6;
}

Assistant:

static JSValue js_object___lookupGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int setter)
{
    JSValue obj, res = JS_EXCEPTION;
    JSAtom prop = JS_ATOM_NULL;
    JSPropertyDescriptor desc;
    int has_prop;

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;
    prop = JS_ValueToAtom(ctx, argv[0]);
    if (unlikely(prop == JS_ATOM_NULL))
        goto exception;

    for (;;) {
        has_prop = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), prop);
        if (has_prop < 0)
            goto exception;
        if (has_prop) {
            if (desc.flags & JS_PROP_GETSET)
                res = JS_DupValue(ctx, setter ? desc.setter : desc.getter);
            else
                res = JS_UNDEFINED;
            js_free_desc(ctx, &desc);
            break;
        }
        obj = JS_GetPrototypeFree(ctx, obj);
        if (JS_IsException(obj))
            goto exception;
        if (JS_IsNull(obj)) {
            res = JS_UNDEFINED;
            break;
        }
        /* avoid infinite loop (possible with proxies) */
        if (js_poll_interrupts(ctx))
            goto exception;
    }

exception:
    JS_FreeAtom(ctx, prop);
    JS_FreeValue(ctx, obj);
    return res;
}